

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O1

int get_crazy_fail(int test)

{
  int iVar1;
  
  if (((((0x2e < test - 0x2cU) || ((0x7e0800000fc1U >> ((ulong)(test - 0x2cU) & 0x3f) & 1) == 0)) &&
       (test != 0x9a)) && (5 < test - 0xa0U)) &&
     (((test - 0xb2U < 0xe && (iVar1 = 0, (0x282fU >> (test - 0xb2U & 0x1f) & 1) != 0)) ||
      (((5 < test - 0xc3U &&
        ((0x1c < test - 0xcbU || ((0x1001300fU >> (test - 0xcbU & 0x1f) & 1) == 0)))) &&
       (iVar1 = 1, 5 < test - 0xedU)))))) {
    return iVar1;
  }
  return 0;
}

Assistant:

static int get_crazy_fail(int test) {
    /*
     * adding 1000000 of character 'a' leads to parser failure mostly
     * everywhere except in those special spots. Need to be updated
     * each time crazy is updated
     */
    int fail = 1;
    if ((test == 44) || /* PI in Misc */
        ((test >= 50) && (test <= 55)) || /* Comment in Misc */
        (test == 79) || /* PI in DTD */
        ((test >= 85) && (test <= 90)) || /* Comment in DTD */
        (test == 154) || /* PI in Misc */
        ((test >= 160) && (test <= 165)) || /* Comment in Misc */
        ((test >= 178) && (test <= 181)) || /* attribute value */
        (test == 183) || /* Text */
        (test == 189) || /* PI in Content */
        (test == 191) || /* Text */
        ((test >= 195) && (test <= 200)) || /* Comment in Content */
        ((test >= 203) && (test <= 206)) || /* Text */
        (test == 215) || (test == 216) || /* in CDATA */
        (test == 219) || /* Text */
        (test == 231) || /* PI in Misc */
        ((test >= 237) && (test <= 242))) /* Comment in Misc */
        fail = 0;
    return(fail);
}